

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::attachCounter
          (ConcurrencyLimitingHttpClient *this,Promise<kj::HttpClient::WebSocketResponse> *promise,
          ConnectionCounter *counter)

{
  ConcurrencyLimitingHttpClient *pCVar1;
  PromiseNode *pPVar2;
  PromiseArena *pPVar3;
  void *pvVar4;
  TransformPromiseNodeBase *this_00;
  ConnectionCounter local_38;
  
  pCVar1 = counter->parent;
  counter->parent = (ConcurrencyLimitingHttpClient *)0x0;
  pPVar2 = (promise->super_PromiseBase).node.ptr;
  pPVar3 = (pPVar2->super_PromiseArenaMember).arena;
  local_38.parent = pCVar1;
  if (pPVar3 == (PromiseArena *)0x0 || (ulong)((long)pPVar2 - (long)pPVar3) < 0x28) {
    pvVar4 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)promise,
               kj::_::
               SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6646:25)>
               ::anon_class_8_1_bc7188dc_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00704ee0;
    *(ConcurrencyLimitingHttpClient **)((long)pvVar4 + 0x3f8) = pCVar1;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    (pPVar2->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&pPVar2[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)promise,
               kj::_::
               SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6646:25)>
               ::anon_class_8_1_bc7188dc_for_func::operator());
    pPVar2[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_00704ee0;
    pPVar2[-1].super_PromiseArenaMember.arena = (PromiseArena *)pCVar1;
    pPVar2[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar3;
  }
  local_38.parent = (ConcurrencyLimitingHttpClient *)0x0;
  (this->super_HttpClient)._vptr_HttpClient = (_func_int **)this_00;
  ConnectionCounter::~ConnectionCounter(&local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

static kj::Promise<WebSocketResponse> attachCounter(kj::Promise<WebSocketResponse>&& promise,
                                                      ConnectionCounter&& counter) {
    return promise.then([counter = kj::mv(counter)](WebSocketResponse&& response) mutable {
      return WebSocketResponse {
        response.statusCode,
        response.statusText,
        response.headers,
        attachCounter(kj::mv(response.webSocketOrBody), kj::mv(counter))
      };
    });
  }